

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementVector
          (DiscreteExtendedKalmanFilterHelper *this,Span<double,__1L> *y)

{
  index_type iVar1;
  Span<double,__1L> *this_00;
  reference peVar2;
  element_type *peVar3;
  long in_RDI;
  int i;
  element_type in_stack_ffffffffffffffc8;
  int local_1c;
  bool local_1;
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x5cfb72);
  if (iVar1 == *(long *)(in_RDI + 0x10)) {
    local_1c = 0;
    while( true ) {
      this_00 = (Span<double,__1L> *)(long)local_1c;
      iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x5cfbba);
      if (iVar1 <= (long)this_00) break;
      peVar2 = Span<double,_-1L>::operator()(this_00,(index_type)in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffc8 = *peVar2;
      peVar3 = (element_type *)
               iDynTree::VectorDynSize::operator()((VectorDynSize *)(in_RDI + 0x60),(long)local_1c);
      *peVar3 = in_stack_ffffffffffffffc8;
      local_1c = local_1c + 1;
    }
    *(undefined1 *)(in_RDI + 0x1e1) = 1;
    local_1 = true;
  }
  else {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","ekfSetMeasurementVector",
               "measurement size mismatch");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementVector(const iDynTree::Span< double >& y)
{
    if ((size_t)y.size() != m_dim_Y)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfSetMeasurementVector", "measurement size mismatch");
        return false;
    }

    for (int i = 0; i < y.size(); i++)
    {
        m_y(i) = y(i);
    }

    m_measurement_updated = true;
    return true;
}